

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O3

int run_test_udp_send_unix(void)

{
  uint __fd;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *loop;
  uv_loop_t *puVar2;
  uv_buf_t buf;
  uv_udp_t handle;
  uv_udp_send_t req;
  uv_buf_t local_2a8;
  undefined1 local_296 [18];
  undefined8 local_284;
  undefined8 uStack_27c;
  undefined8 local_274;
  undefined8 uStack_26c;
  undefined8 local_264;
  undefined8 uStack_25c;
  undefined8 local_254;
  undefined8 uStack_24c;
  undefined8 local_244;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined8 uStack_230;
  undefined1 local_228 [536];
  
  local_2a8 = uv_buf_init("PING",4);
  loop = uv_default_loop();
  uStack_27c = 0;
  local_274 = 0;
  uStack_26c = 0;
  local_264 = 0;
  uStack_25c = 0;
  local_254 = 0;
  uStack_24c = 0;
  local_244 = 0;
  uStack_23c = 0;
  uStack_238 = 0;
  uStack_234 = 0;
  uStack_230 = 0;
  local_296._0_2_ = 1;
  local_296[2] = '/';
  local_296[3] = 't';
  local_296[4] = 'm';
  local_296[5] = 'p';
  local_296[6] = '/';
  local_296[7] = 'u';
  local_296[8] = 'v';
  local_296[9] = '-';
  local_296[10] = 't';
  local_296[0xb] = 'e';
  local_296[0xc] = 's';
  local_296[0xd] = 't';
  local_296[0xe] = '-';
  local_296[0xf] = 's';
  local_296[0x10] = 'o';
  local_296[0x11] = 'c';
  local_284 = 0x6b;
  puVar2 = (uv_loop_t *)0x1;
  __fd = socket(1,1,0);
  if ((int)__fd < 0) {
    run_test_udp_send_unix_cold_1();
LAB_0017901c:
    run_test_udp_send_unix_cold_2();
LAB_00179021:
    run_test_udp_send_unix_cold_3();
LAB_00179026:
    run_test_udp_send_unix_cold_4();
LAB_0017902b:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar2 = (uv_loop_t *)(ulong)__fd;
    iVar1 = bind(__fd,(sockaddr *)local_296,0x6e);
    if (iVar1 != 0) goto LAB_0017901c;
    puVar2 = (uv_loop_t *)(ulong)__fd;
    iVar1 = listen(__fd,1);
    if (iVar1 != 0) goto LAB_00179021;
    puVar2 = loop;
    iVar1 = uv_udp_init(loop,(uv_udp_t *)local_228);
    if (iVar1 != 0) goto LAB_00179026;
    puVar2 = (uv_loop_t *)local_228;
    iVar1 = uv_udp_open((uv_udp_t *)puVar2,__fd);
    if (iVar1 != 0) goto LAB_0017902b;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar2 = (uv_loop_t *)(local_228 + 0xd8);
    iVar1 = uv_udp_send((uv_udp_send_t *)puVar2,(uv_udp_t *)local_228,&local_2a8,1,
                        (sockaddr *)local_296,(uv_udp_send_cb)0x0);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)local_228,(uv_close_cb)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      close(__fd);
      unlink("/tmp/uv-test-sock");
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00179035;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_00179035:
  run_test_udp_send_unix_cold_7();
  if (puVar2 != (uv_loop_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(udp_send_unix) {
  /* Test that "uv_udp_send()" supports sending over
     a "sockaddr_un" address. */
  struct sockaddr_un addr;
  uv_udp_t handle;
  uv_udp_send_t req;
  uv_loop_t* loop;
  uv_buf_t buf = uv_buf_init("PING", 4);
  int fd;
  int r;

  loop = uv_default_loop();

  memset(&addr, 0, sizeof addr);
  addr.sun_family = AF_UNIX;
  ASSERT(strlen(TEST_PIPENAME) < sizeof(addr.sun_path));
  memcpy(addr.sun_path, TEST_PIPENAME, strlen(TEST_PIPENAME));

  fd = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT(fd >= 0);

  unlink(TEST_PIPENAME);
  ASSERT(0 == bind(fd, (const struct sockaddr*)&addr, sizeof addr));
  ASSERT(0 == listen(fd, 1));

  r = uv_udp_init(loop, &handle);
  ASSERT(r == 0);
  r = uv_udp_open(&handle, fd);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_udp_send(&req,
                  &handle,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  NULL);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)&handle, NULL);
  uv_run(loop, UV_RUN_DEFAULT);
  close(fd);
  unlink(TEST_PIPENAME);

  MAKE_VALGRIND_HAPPY();
  return 0;
}